

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse-2-typedefs.cpp
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::parseTypeDefs
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *decls,Lexer *input,
          IndexMap *typeIndices,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
          *typeNames)

{
  TypeNames *__y;
  uint uVar1;
  pointer pDVar2;
  Module *pMVar3;
  size_type sVar4;
  ParseDeclsCtx *pPVar5;
  ostream *os;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  _Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var6;
  ulong uVar7;
  __node_base *p_Var8;
  pointer pDVar9;
  __hashtable *__h;
  undefined1 auStack_2d8 [8];
  WithPosition<wasm::WATParser::ParseTypeDefsCtx> with;
  undefined1 local_150 [8];
  ParseTypeDefsCtx ctx;
  undefined1 local_a0 [8];
  BuildResult built;
  Err local_78;
  ParseDeclsCtx *local_50;
  TypeBuilder local_48;
  TypeBuilder builder;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)types;
  TypeBuilder::TypeBuilder
            (&local_48,
             ((long)(decls->typeDefs).
                    super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(decls->typeDefs).
                   super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  ParseTypeDefsCtx::ParseTypeDefsCtx((ParseTypeDefsCtx *)local_150,input,&local_48,typeIndices);
  pDVar9 = (decls->recTypeDefs).
           super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (decls->recTypeDefs).
           super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_50 = decls;
  do {
    if (pDVar9 == pDVar2) {
      TypeBuilder::build((BuildResult *)local_a0,&local_48);
      pPVar5 = local_50;
      if (built.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _M_first._M_storage._M_storage[0x10] == '\x01') {
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_2d8);
        os = std::operator<<((ostream *)&with.original,"invalid type: ");
        wasm::operator<<(os,built.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._M_u._0_4_);
        uVar1 = (pPVar5->typeDefs).
                super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)local_a0].pos;
        std::__cxx11::stringbuf::str();
        Lexer::err(&local_78,(Lexer *)&ctx,(ulong)uVar1,(string *)&ctx.index);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&ctx.index);
        std::__cxx11::stringstream::~stringstream((stringstream *)auStack_2d8);
      }
      else {
        __x = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)local_a0);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,__x);
        for (uVar7 = 0;
            uVar7 < (ulong)(*(long *)((long)builder.impl._M_t.
                                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>
                                            ._M_head_impl + 8) -
                            *(long *)builder.impl._M_t.
                                     super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                     .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                     _M_head_impl >> 3); uVar7 = uVar7 + 1) {
          __y = (TypeNames *)(ctx.builder + uVar7 * 9);
          if ((ctx.builder[uVar7 * 9 + 1].impl._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl != (Impl *)0x0)
             || ((__y->fieldNames)._M_h._M_element_count != 0)) {
            pMVar3 = local_50->wasm;
            std::pair<const_wasm::HeapType,_wasm::TypeNames>::
            pair<wasm::HeapType_&,_wasm::TypeNames_&,_true>
                      ((pair<const_wasm::HeapType,_wasm::TypeNames> *)auStack_2d8,
                       (HeapType *)
                       (*(long *)builder.impl._M_t.
                                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                 _M_head_impl + uVar7 * 8),__y);
            std::
            _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<wasm::HeapType_const,wasm::TypeNames>>
                      ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&pMVar3->typeNames,
                       (pair<const_wasm::HeapType,_wasm::TypeNames> *)auStack_2d8);
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)&with.annotations);
            p_Var6 = (_Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)typeNames,
                                     (key_type *)
                                     (uVar7 * 8 +
                                     *(long *)builder.impl._M_t.
                                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                              .
                                              super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>
                                              ._M_head_impl));
            p_Var8 = &(__y->fieldNames)._M_h._M_before_begin;
            while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
              with.original = (Index)*(size_type *)(p_Var8 + 1);
              with.ctx._4_4_ = *(undefined4 *)((long)(p_Var8 + 3) + 4);
              sVar4 = *(size_type *)&((_Prime_rehash_policy *)(p_Var8 + 2))->field_0x4;
              local_78.msg._M_dataplus._M_p._4_4_ =
                   (undefined4)((ulong)*(pointer *)((long)(p_Var8 + 1) + 4) >> 0x20);
              local_78.msg._M_string_length._0_4_ = (undefined4)sVar4;
              local_78.msg._M_string_length._4_4_ = (undefined4)(sVar4 >> 0x20);
              auStack_2d8._0_4_ = local_78.msg._M_dataplus._M_p._4_4_;
              auStack_2d8._4_4_ = (undefined4)local_78.msg._M_string_length;
              with.ctx._0_4_ = local_78.msg._M_string_length._4_4_;
              local_78.msg._M_dataplus._M_p = *(pointer *)((long)(p_Var8 + 1) + 4);
              local_78.msg._M_string_length = sVar4;
              local_78.msg.field_2._M_allocated_capacity._0_4_ = with.ctx._4_4_;
              std::
              _Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::pair<wasm::Name_const,unsigned_int>>
                        (p_Var6,(pair<const_wasm::HeapType,_wasm::TypeNames> *)auStack_2d8);
            }
          }
        }
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           *)local_a0);
LAB_00c31162:
      ParseTypeDefsCtx::~ParseTypeDefsCtx((ParseTypeDefsCtx *)local_150);
      TypeBuilder::~TypeBuilder(&local_48);
      return __return_storage_ptr__;
    }
    WithPosition<wasm::WATParser::ParseTypeDefsCtx>::WithPosition
              ((WithPosition<wasm::WATParser::ParseTypeDefsCtx> *)auStack_2d8,
               (ParseTypeDefsCtx *)local_150,pDVar9->pos);
    rectype<wasm::WATParser::ParseTypeDefsCtx>
              ((MaybeResult<wasm::Ok> *)local_a0,(ParseTypeDefsCtx *)local_150);
    if (built.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
        == '\x02') {
      std::__cxx11::string::string((string *)&local_78,(string *)local_a0);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_a0);
      WithPosition<wasm::WATParser::ParseTypeDefsCtx>::~WithPosition
                ((WithPosition<wasm::WATParser::ParseTypeDefsCtx> *)auStack_2d8);
      goto LAB_00c31162;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_a0);
    WithPosition<wasm::WATParser::ParseTypeDefsCtx>::~WithPosition
              ((WithPosition<wasm::WATParser::ParseTypeDefsCtx> *)auStack_2d8);
    pDVar9 = pDVar9 + 1;
  } while( true );
}

Assistant:

Result<> parseTypeDefs(
  ParseDeclsCtx& decls,
  Lexer& input,
  IndexMap& typeIndices,
  std::vector<HeapType>& types,
  std::unordered_map<HeapType, std::unordered_map<Name, Index>>& typeNames) {
  TypeBuilder builder(decls.typeDefs.size());
  ParseTypeDefsCtx ctx(input, builder, typeIndices);
  for (auto& recType : decls.recTypeDefs) {
    WithPosition with(ctx, recType.pos);
    CHECK_ERR(rectype(ctx));
  }
  auto built = builder.build();
  if (auto* err = built.getError()) {
    std::stringstream msg;
    msg << "invalid type: " << err->reason;
    return ctx.in.err(decls.typeDefs[err->index].pos, msg.str());
  }
  types = *built;
  // Record type names on the module and in typeNames.
  for (size_t i = 0; i < types.size(); ++i) {
    auto& names = ctx.names[i];
    auto& fieldNames = names.fieldNames;
    if (names.name.is() || fieldNames.size()) {
      decls.wasm.typeNames.insert({types[i], names});
      auto& fieldIdxMap = typeNames[types[i]];
      for (auto [idx, name] : fieldNames) {
        fieldIdxMap.insert({name, idx});
      }
    }
  }
  return Ok{};
}